

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O1

void __thiscall
syntax_gtest_tests::syntax_tests::iu_GTestSyntaxTest_x_iutest_x_ExceptionNoThrow_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_ExceptionNoThrow_Test *this)

{
  return;
}

Assistant:

TEST(GTestSyntaxTest, ExceptionNoThrow)
{
    if( int x = 1 )
        ASSERT_NO_THROW((void)x) << x;
    if( int x = 1 )
        EXPECT_NO_THROW((void)x) << x;
    if( int x = 1 )
        INFORM_NO_THROW((void)x) << x;
    if( int x = 1 )
        ASSUME_NO_THROW((void)x) << x;
}